

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionMultiCond.cpp
# Opt level: O3

void __thiscall
Hpipe::InstructionMultiCond::optimize_conditions
          (InstructionMultiCond *this,PtrPool<Hpipe::Instruction,_32> *inst_pool)

{
  double dVar1;
  pointer pCVar2;
  pointer pdVar3;
  pointer pTVar4;
  pointer pTVar5;
  pointer pRVar6;
  int iVar7;
  ulong uVar8;
  mapped_type_conflict *pmVar9;
  Instruction *pIVar10;
  long lVar11;
  uint uVar12;
  Vec<Hpipe::BranchSet::Range> *__range1;
  uint i;
  ulong uVar13;
  Range *range;
  pointer pRVar14;
  pointer pRVar15;
  Transition *t;
  pointer pTVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  Vec<Hpipe::BranchSet::Range> ranges;
  map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
  nb_ranges;
  BranchSet best_bs;
  Instruction *inst [256];
  vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_> local_8b8;
  undefined1 local_8a0 [8];
  _Rb_tree_node_base _Stack_898;
  size_t local_878;
  vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_> local_870;
  AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete> local_858;
  Cond local_848;
  long local_828 [256];
  
  if ((this->super_Instruction).op_id == Instruction::cur_op_id) {
    return;
  }
  (this->super_Instruction).op_id = Instruction::cur_op_id;
  memset(local_828,0,0x800);
  pCVar2 = (this->conds).super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
           super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar11 = (long)(this->conds).super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                 super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pCVar2;
  if (lVar11 != 0) {
    pTVar16 = (this->super_Instruction).next.
              super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
              super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      uVar13 = 0;
      do {
        if ((pCVar2[uVar8].p.super__Base_bitset<4UL>._M_w[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0)
        {
          local_828[uVar13] = (long)pTVar16[uVar8].inst;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != 0x100);
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (uVar8 < (ulong)(lVar11 >> 5));
  }
  local_8b8.super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
  _M_impl.super__Vector_impl_data._M_start = (Range *)0x0;
  local_8b8.super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
  _M_impl.super__Vector_impl_data._M_finish = (Range *)0x0;
  local_8b8.super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (Range *)0x0;
  uVar8 = 0;
  while (local_828[uVar8] == 0) {
    uVar8 = uVar8 + 1;
    if (uVar8 == 0x100) goto LAB_0016c9ff;
  }
  if (uVar8 < 0xff) {
    uVar13 = uVar8 + 1;
    _Stack_898._M_left = (_Base_ptr)0x0;
    do {
      if ((Instruction *)local_828[uVar13] != (Instruction *)0x0) {
        iVar7 = (int)uVar8;
        pIVar10 = (Instruction *)local_828[iVar7];
        if ((Instruction *)local_828[uVar13] != pIVar10) {
          local_8a0._4_4_ = (undefined4)uVar13;
          _Stack_898._M_parent = (_Base_ptr)0x0;
          local_8a0._0_4_ = iVar7;
          _Stack_898._0_8_ = pIVar10;
          if (local_8b8.
              super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_8b8.
              super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::
            _M_realloc_insert<Hpipe::BranchSet::Range>
                      (&local_8b8,
                       (iterator)
                       local_8b8.
                       super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(Range *)local_8a0);
          }
          else {
            (local_8b8.
             super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
             _M_impl.super__Vector_impl_data._M_finish)->name = (char *)0x0;
            (local_8b8.
             super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
             _M_impl.super__Vector_impl_data._M_finish)->freq = (double)_Stack_898._M_left;
            (local_8b8.
             super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
             _M_impl.super__Vector_impl_data._M_finish)->beg = iVar7;
            (local_8b8.
             super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
             _M_impl.super__Vector_impl_data._M_finish)->end = local_8a0._4_4_;
            (local_8b8.
             super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
             _M_impl.super__Vector_impl_data._M_finish)->inst = pIVar10;
            local_8b8.
            super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_8b8.
                 super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          _Stack_898._M_left = (_Base_ptr)0x0;
          uVar8 = uVar13 & 0xffffffff;
        }
      }
      pdVar3 = (this->super_Instruction).freq.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if ((this->super_Instruction).freq.super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish == pdVar3) {
        uVar17 = 0;
        uVar18 = 0;
      }
      else {
        dVar1 = pdVar3[uVar13];
        uVar17 = SUB84(dVar1,0);
        uVar18 = (undefined4)((ulong)dVar1 >> 0x20);
      }
      _Stack_898._M_left = (_Base_ptr)((double)_Stack_898._M_left + (double)CONCAT44(uVar18,uVar17))
      ;
      uVar13 = uVar13 + 1;
    } while (uVar13 != 0x100);
  }
  else {
    _Stack_898._M_left = (_Base_ptr)0x0;
  }
  iVar7 = (int)uVar8;
  if (iVar7 != 0x100) {
    local_8a0._4_4_ = 0x100;
    _Stack_898._0_8_ = local_828[iVar7];
    _Stack_898._M_parent = (_Base_ptr)0x0;
    local_8a0._0_4_ = iVar7;
    if (local_8b8.
        super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_8b8.
        super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::
      _M_realloc_insert<Hpipe::BranchSet::Range>
                (&local_8b8,
                 (iterator)
                 local_8b8.
                 super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(Range *)local_8a0);
    }
    else {
      (local_8b8.
       super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl
       .super__Vector_impl_data._M_finish)->name = (char *)0x0;
      (local_8b8.
       super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl
       .super__Vector_impl_data._M_finish)->freq = (double)_Stack_898._M_left;
      (local_8b8.
       super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl
       .super__Vector_impl_data._M_finish)->beg = iVar7;
      (local_8b8.
       super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl
       .super__Vector_impl_data._M_finish)->end = 0x100;
      (local_8b8.
       super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl
       .super__Vector_impl_data._M_finish)->inst = (Instruction *)_Stack_898._0_8_;
      local_8b8.
      super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_8b8.
           super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
LAB_0016c9ff:
  pRVar15 = local_8b8.
            super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  _Stack_898._M_left = &_Stack_898;
  _Stack_898._0_8_ = _Stack_898._0_8_ & 0xffffffff00000000;
  _Stack_898._M_parent = (_Base_ptr)0x0;
  local_878 = 0;
  _Stack_898._M_right = _Stack_898._M_left;
  if (local_8b8.
      super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_8b8.
      super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pRVar14 = local_8b8.
              super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      pmVar9 = std::
               map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
               ::operator[]((map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
                             *)local_8a0,&pRVar14->inst);
      pRVar6 = local_8b8.
               super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      *pmVar9 = *pmVar9 + 1.0;
      pRVar14 = pRVar14 + 1;
    } while (pRVar14 != pRVar15);
    if (local_8b8.
        super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_8b8.
        super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pRVar15 = local_8b8.
                super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pmVar9 = std::
                 map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
                 ::operator[]((map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
                               *)local_8a0,&pRVar15->inst);
        pRVar15->freq = 0.001 / *pmVar9 + pRVar15->freq;
        pRVar15 = pRVar15 + 1;
      } while (pRVar15 != pRVar6);
    }
  }
  std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::vector
            (&local_870,&local_8b8);
  BranchSet::BranchSet((BranchSet *)&local_858,(Vec<Hpipe::BranchSet::Range> *)&local_870);
  if (local_870.
      super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_870.
                    super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_870.
                          super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_870.
                          super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Cond::Cond(&local_848);
  pIVar10 = InstructionCond::make_cond
                      (local_858.data,inst_pool,&local_848,(this->super_Instruction).in_a_cycle,
                       (this->super_Instruction).mark,this->off_data);
  Instruction::repl_in_preds(&this->super_Instruction,pIVar10);
  pTVar16 = (this->super_Instruction).next.
            super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
            super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
            super__Vector_impl_data._M_start;
  pTVar4 = (this->super_Instruction).next.
           super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
           super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar16 != pTVar4) {
    do {
      pIVar10 = pTVar16->inst;
      pTVar5 = (pIVar10->prev).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
               super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = (long)(pIVar10->prev).
                     super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                     super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar5;
      if (lVar11 != 0) {
        uVar8 = (lVar11 >> 3) * -0x3333333333333333;
        uVar12 = 1;
        uVar13 = 0;
        do {
          if ((InstructionMultiCond *)pTVar5[uVar13].inst == this) {
            std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::_M_erase
                      (&(pIVar10->prev).
                        super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>,
                       pTVar5 + uVar13,(pTVar5 + uVar13)._M_current + 1);
            break;
          }
          uVar13 = (ulong)uVar12;
          uVar12 = uVar12 + 1;
        } while (uVar13 <= uVar8 && uVar8 - uVar13 != 0);
      }
      pTVar16 = pTVar16 + 1;
    } while (pTVar16 != pTVar4);
    pTVar4 = (this->super_Instruction).next.
             super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
             super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pTVar16 = (this->super_Instruction).next.
                   super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                   super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl
                   .super__Vector_impl_data._M_start; pTVar16 != pTVar4; pTVar16 = pTVar16 + 1) {
      (*pTVar16->inst->_vptr_Instruction[0xe])(pTVar16->inst,inst_pool);
    }
  }
  AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::~AutoPtr(&local_858);
  std::
  _Rb_tree<Hpipe::Instruction_*,_std::pair<Hpipe::Instruction_*const,_double>,_std::_Select1st<std::pair<Hpipe::Instruction_*const,_double>_>,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
  ::~_Rb_tree((_Rb_tree<Hpipe::Instruction_*,_std::pair<Hpipe::Instruction_*const,_double>,_std::_Select1st<std::pair<Hpipe::Instruction_*const,_double>_>,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
               *)local_8a0);
  if (local_8b8.
      super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
      super__Vector_impl_data._M_start == (Range *)0x0) {
    return;
  }
  operator_delete(local_8b8.
                  super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (long)local_8b8.
                        super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_8b8.
                        super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void InstructionMultiCond::optimize_conditions( PtrPool<Instruction> &inst_pool ) {
    if ( op_id == Instruction::cur_op_id )
        return;
    op_id = Instruction::cur_op_id;

    // char => instruction
    Instruction *inst[ 256 ];
    for( unsigned i = 0; i < 256; ++i )
        inst[ i ] = 0;
    for( unsigned n = 0; n < conds.size(); ++n )
        for( unsigned i = 0; i < 256; ++i )
            if ( conds[ n ][ i ] )
                inst[ i ] = next[ n ].inst;

    // input for BranchSet
    Vec<BranchSet::Range> ranges;
    double cum_freq = 0;
    int o = 0;
    while ( o < 256 and not inst[ o ] )
        ++o;
    for( int i = o + 1; i < 256; ++i ) {
        if ( inst[ i ] and inst[ i ] != inst[ o ] ) {
            ranges.emplace_back( BranchSet::Range{ o, i, inst[ o ], nullptr, cum_freq } );
            cum_freq = 0;
            o = i;
        }
        cum_freq += freq.size() ? freq[ i ] : 0;
    }
    if ( o != 256 )
        ranges.emplace_back( BranchSet::Range{ o, 256, inst[ o ], nullptr, cum_freq } );

    // to avoid freq 0
    std::map<Instruction *,double> nb_ranges;
    for( BranchSet::Range &range : ranges )
        ++nb_ranges[ range.inst ];
    for( BranchSet::Range &range : ranges )
        range.freq += 1e-3 / nb_ranges[ range.inst ];

    // if succession of cond seams to be a better solution, use them
    BranchSet best_bs( ranges );
    repl_in_preds( InstructionCond::make_cond( best_bs.root.ptr(), inst_pool, {}, in_a_cycle, mark, off_data ) );
    for( Transition &t : next )
        t.inst->prev.remove_first_checking( [&]( Transition &p ) { return p.inst == this; } );

    // following conditions
    for( Transition &t : next )
        t.inst->optimize_conditions( inst_pool );
}